

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O1

void __thiscall
slang::ast::ParameterBuilder::ParameterBuilder
          (ParameterBuilder *this,Scope *scope,string_view definitionName,
          span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL> parameterDecls)

{
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>
  *psVar1;
  
  this->scope = scope;
  (this->definitionName)._M_len = definitionName._M_len;
  (this->definitionName)._M_str = definitionName._M_str;
  (this->parameterDecls).data_ = parameterDecls.data_;
  (this->parameterDecls).size_ = parameterDecls.size_;
  (this->assignments).
  super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>
  .ptr = (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>
          *)&this->assignments;
  (this->assignments).
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>
  .storage = &(this->assignments).
              super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>
  ;
  psVar1 = ska::detailv3::
           empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ExpressionSyntax_const*>>
                     ();
  (this->assignments).
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .entries = psVar1;
  (this->assignments).
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .num_slots_minus_one = 0;
  (this->assignments).
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .hash_policy = '?';
  (this->assignments).
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .max_lookups = '\x03';
  (this->assignments).
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  ._max_load_factor = 0.5;
  (this->assignments).
  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  .num_elements = 0;
  this->instanceContext = (ASTContext *)0x0;
  *(undefined8 *)((long)&this->instanceContext + 3) = 0;
  *(undefined8 *)((long)&this->overrideNode + 3) = 0;
  return;
}

Assistant:

ParameterBuilder::ParameterBuilder(const Scope& scope, string_view definitionName,
                                   span<const Decl> parameterDecls) :
    scope(scope),
    definitionName(definitionName), parameterDecls(parameterDecls) {
}